

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O2

void add_ref_mv_candidate
               (MB_MODE_INFO *candidate,MV_REFERENCE_FRAME *rf,uint8_t *refmv_count,
               uint8_t *ref_match_count,uint8_t *newmv_count,CANDIDATE_MV *ref_mv_stack,
               uint16_t *ref_mv_weight,int_mv *gm_mv_candidates,WarpedMotionParams *gm_params,
               uint16_t weight)

{
  uint32_t uVar1;
  int iVar2;
  int_mv *piVar3;
  int_mv *piVar4;
  ulong uVar5;
  byte bVar6;
  long lVar7;
  int_mv local_38;
  uint32_t local_34;
  
  if (((candidate->field_0xa7 & 0x80) != 0) || ('\0' < candidate->ref_frame[0])) {
    if (rf[1] == -1) {
      for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
        if (candidate->ref_frame[lVar7] == *rf) {
          iVar2 = is_global_mv_block(candidate,gm_params[candidate->ref_frame[lVar7]].wmtype);
          piVar4 = candidate->mv + lVar7;
          if (iVar2 != 0) {
            piVar4 = gm_mv_candidates;
          }
          uVar1 = piVar4->as_int;
          bVar6 = *refmv_count;
          for (uVar5 = 0; bVar6 != uVar5; uVar5 = uVar5 + 1) {
            if (ref_mv_stack[uVar5].this_mv.as_int == uVar1) {
              ref_mv_weight[uVar5] = ref_mv_weight[uVar5] + weight;
              bVar6 = *refmv_count;
              goto LAB_00330e23;
            }
          }
          uVar5 = (ulong)bVar6;
LAB_00330e23:
          if (bVar6 < 8 && (uint)uVar5 == (uint)bVar6) {
            ref_mv_stack[uVar5 & 0xffffffff].this_mv.as_int = uVar1;
            ref_mv_weight[uVar5 & 0xffffffff] = weight;
            *refmv_count = *refmv_count + '\x01';
          }
          if ((candidate->mode < 0x19) && ((0x1790000U >> (candidate->mode & 0x1f) & 1) != 0)) {
            *newmv_count = *newmv_count + '\x01';
          }
          *ref_match_count = *ref_match_count + '\x01';
        }
      }
    }
    else if ((candidate->ref_frame[0] == *rf) && (candidate->ref_frame[1] == rf[1])) {
      piVar4 = candidate->mv;
      for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
        iVar2 = is_global_mv_block(candidate,gm_params[rf[lVar7]].wmtype);
        piVar3 = gm_mv_candidates;
        if (iVar2 == 0) {
          piVar3 = piVar4;
        }
        (&local_38)[lVar7] = *piVar3;
        gm_mv_candidates = gm_mv_candidates + 1;
        piVar4 = piVar4 + 1;
      }
      bVar6 = *refmv_count;
      for (uVar5 = 0; bVar6 != uVar5; uVar5 = uVar5 + 1) {
        if ((ref_mv_stack[uVar5].this_mv.as_int == local_38.as_int) &&
           (ref_mv_stack[uVar5].comp_mv.as_int == local_34)) {
          ref_mv_weight[uVar5] = ref_mv_weight[uVar5] + weight;
          bVar6 = *refmv_count;
          goto LAB_00330ec6;
        }
      }
      uVar5 = (ulong)bVar6;
LAB_00330ec6:
      if (bVar6 < 8 && (uint)uVar5 == (uint)bVar6) {
        uVar5 = uVar5 & 0xffffffff;
        ref_mv_stack[uVar5].this_mv.as_int = (uint32_t)local_38;
        ref_mv_stack[uVar5].comp_mv.as_int = local_34;
        ref_mv_weight[uVar5] = weight;
        *refmv_count = *refmv_count + '\x01';
      }
      if ((candidate->mode < 0x19) && ((0x1790000U >> (candidate->mode & 0x1f) & 1) != 0)) {
        *newmv_count = *newmv_count + '\x01';
      }
      *ref_match_count = *ref_match_count + '\x01';
    }
  }
  return;
}

Assistant:

static inline void add_ref_mv_candidate(
    const MB_MODE_INFO *const candidate, const MV_REFERENCE_FRAME rf[2],
    uint8_t *refmv_count, uint8_t *ref_match_count, uint8_t *newmv_count,
    CANDIDATE_MV *ref_mv_stack, uint16_t *ref_mv_weight,
    int_mv *gm_mv_candidates, const WarpedMotionParams *gm_params,
    uint16_t weight) {
  if (!is_inter_block(candidate)) return;
  assert(weight % 2 == 0);
  int index, ref;

  if (rf[1] == NONE_FRAME) {
    // single reference frame
    for (ref = 0; ref < 2; ++ref) {
      if (candidate->ref_frame[ref] == rf[0]) {
        const int is_gm_block =
            is_global_mv_block(candidate, gm_params[rf[0]].wmtype);
        const int_mv this_refmv =
            is_gm_block ? gm_mv_candidates[0] : get_block_mv(candidate, ref);
        for (index = 0; index < *refmv_count; ++index) {
          if (ref_mv_stack[index].this_mv.as_int == this_refmv.as_int) {
            ref_mv_weight[index] += weight;
            break;
          }
        }

        // Add a new item to the list.
        if (index == *refmv_count && *refmv_count < MAX_REF_MV_STACK_SIZE) {
          ref_mv_stack[index].this_mv = this_refmv;
          ref_mv_weight[index] = weight;
          ++(*refmv_count);
        }
        if (have_newmv_in_inter_mode(candidate->mode)) ++*newmv_count;
        ++*ref_match_count;
      }
    }
  } else {
    // compound reference frame
    if (candidate->ref_frame[0] == rf[0] && candidate->ref_frame[1] == rf[1]) {
      int_mv this_refmv[2];

      for (ref = 0; ref < 2; ++ref) {
        if (is_global_mv_block(candidate, gm_params[rf[ref]].wmtype))
          this_refmv[ref] = gm_mv_candidates[ref];
        else
          this_refmv[ref] = get_block_mv(candidate, ref);
      }

      for (index = 0; index < *refmv_count; ++index) {
        if ((ref_mv_stack[index].this_mv.as_int == this_refmv[0].as_int) &&
            (ref_mv_stack[index].comp_mv.as_int == this_refmv[1].as_int)) {
          ref_mv_weight[index] += weight;
          break;
        }
      }

      // Add a new item to the list.
      if (index == *refmv_count && *refmv_count < MAX_REF_MV_STACK_SIZE) {
        ref_mv_stack[index].this_mv = this_refmv[0];
        ref_mv_stack[index].comp_mv = this_refmv[1];
        ref_mv_weight[index] = weight;
        ++(*refmv_count);
      }
      if (have_newmv_in_inter_mode(candidate->mode)) ++*newmv_count;
      ++*ref_match_count;
    }
  }
}